

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_intercept.cpp
# Opt level: O3

void duckdb::RegrInterceptOperation::Finalize<double,duckdb::RegrInterceptState>
               (RegrInterceptState *state,double *target,AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  double dVar2;
  
  if (state->count != 0) {
    RegrSlopeOperation::Finalize<double,duckdb::RegrSlopeState>(&state->slope,target,finalize_data);
    bVar1 = duckdb::Value::IsNan<double>(*target);
    if (!bVar1) {
      dVar2 = ((double)CONCAT44(0x45300000,(int)(state->count >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)state->count) - 4503599627370496.0);
      *target = state->sum_y / dVar2 - (state->sum_x / dVar2) * *target;
      return;
    }
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
			return;
		}
		RegrSlopeOperation::Finalize<T, RegrSlopeState>(state.slope, target, finalize_data);
		if (Value::IsNan(target)) {
			finalize_data.ReturnNull();
			return;
		}
		auto x_avg = state.sum_x / state.count;
		auto y_avg = state.sum_y / state.count;
		target = y_avg - target * x_avg;
	}